

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::Triangle::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,Triangle *this,Ray *ray,
          Float tMax)

{
  Float time;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int triIndex;
  TriangleMesh *mesh;
  int *piVar7;
  Point3f *pPVar8;
  long lVar9;
  TriangleIntersection *pTVar10;
  long in_FS_OFFSET;
  undefined1 auVar12 [56];
  undefined1 auVar11 [64];
  Point3f p0;
  Point3f p1;
  Point3f p2;
  Vector3<float> VVar13;
  optional<pbrt::TriangleIntersection> triIsect;
  SurfaceInteraction intr;
  optional<pbrt::TriangleIntersection> local_23c;
  ShapeIntersection local_228;
  SurfaceInteraction local_128;
  
  lVar9 = allMeshes;
  *(long *)(in_FS_OFFSET + -0x3f0) = *(long *)(in_FS_OFFSET + -0x3f0) + 1;
  mesh = *(TriangleMesh **)(*(long *)(lVar9 + 8) + (long)this->meshIndex * 8);
  lVar9 = (long)this->triIndex;
  piVar7 = mesh->vertexIndices;
  pPVar8 = mesh->p;
  uVar1 = pPVar8[piVar7[lVar9 * 3]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar4 = pPVar8[piVar7[lVar9 * 3]].super_Tuple3<pbrt::Point3,_float>.y;
  p0.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar4;
  p0.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar1;
  uVar2 = pPVar8[piVar7[lVar9 * 3 + 2]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar5 = pPVar8[piVar7[lVar9 * 3 + 2]].super_Tuple3<pbrt::Point3,_float>.y;
  p2.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar5;
  p2.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar2;
  uVar3 = pPVar8[piVar7[lVar9 * 3 + 1]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar6 = pPVar8[piVar7[lVar9 * 3 + 1]].super_Tuple3<pbrt::Point3,_float>.y;
  p1.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar6;
  p1.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar3;
  p0.super_Tuple3<pbrt::Point3,_float>.z =
       pPVar8[piVar7[lVar9 * 3]].super_Tuple3<pbrt::Point3,_float>.z;
  p1.super_Tuple3<pbrt::Point3,_float>.z =
       pPVar8[piVar7[lVar9 * 3 + 1]].super_Tuple3<pbrt::Point3,_float>.z;
  p2.super_Tuple3<pbrt::Point3,_float>.z =
       pPVar8[piVar7[lVar9 * 3 + 2]].super_Tuple3<pbrt::Point3,_float>.z;
  IntersectTriangle(&local_23c,ray,tMax,p0,p1,p2);
  if (local_23c.set == false) {
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    triIndex = this->triIndex;
    pTVar10 = pstd::optional<pbrt::TriangleIntersection>::value(&local_23c);
    time = ray->time;
    auVar12 = (undefined1  [56])0x0;
    VVar13 = Tuple3<pbrt::Vector3,_float>::operator-(&(ray->d).super_Tuple3<pbrt::Vector3,_float>);
    auVar11._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar11._8_56_ = auVar12;
    local_228.intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = (Interval)vmovlps_avx(auVar11._0_16_);
    local_228.intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
    InteractionFromIntersection(&local_128,mesh,triIndex,pTVar10,time,(Vector3f *)&local_228);
    *(long *)(in_FS_OFFSET + -1000) = *(long *)(in_FS_OFFSET + -1000) + 1;
    local_228.intr.super_Interaction.mediumInterface = local_128.super_Interaction.mediumInterface;
    local_228.intr.super_Interaction.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = local_128.super_Interaction.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
    local_228.intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
         local_128.super_Interaction.pi.super_Point3<pbrt::Interval>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
    local_228.intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
         local_128.super_Interaction.pi.super_Point3<pbrt::Interval>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
    local_228.intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
         local_128.super_Interaction.pi.super_Point3<pbrt::Interval>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
    local_228.intr.super_Interaction.time = local_128.super_Interaction.time;
    local_228.intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x =
         local_128.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
    local_228.intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y =
         local_128.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
    local_228.intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
         local_128.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
    local_228.intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
         local_128.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
    local_228.intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
         local_128.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y;
    local_228.intr.super_Interaction._60_4_ = local_128.super_Interaction._60_4_;
    local_228.intr.dpdu.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.dpdu.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.dpdu.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.dpdu.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.dpdv.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.dpdv.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.dpdv.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.dpdv.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.dpdv.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.dndu.super_Tuple3<pbrt::Normal3,_float>.x =
         local_128.dndu.super_Tuple3<pbrt::Normal3,_float>.x;
    local_228.intr.dndu.super_Tuple3<pbrt::Normal3,_float>.y =
         local_128.dndu.super_Tuple3<pbrt::Normal3,_float>.y;
    local_228.intr.dndu.super_Tuple3<pbrt::Normal3,_float>.z =
         local_128.dndu.super_Tuple3<pbrt::Normal3,_float>.z;
    local_228.intr.dndv.super_Tuple3<pbrt::Normal3,_float>.x =
         local_128.dndv.super_Tuple3<pbrt::Normal3,_float>.x;
    local_228.intr.dndv.super_Tuple3<pbrt::Normal3,_float>.y =
         local_128.dndv.super_Tuple3<pbrt::Normal3,_float>.y;
    local_228.intr.dndv.super_Tuple3<pbrt::Normal3,_float>.z =
         local_128.dndv.super_Tuple3<pbrt::Normal3,_float>.z;
    local_228.intr.shading.n.super_Tuple3<pbrt::Normal3,_float>.x =
         local_128.shading.n.super_Tuple3<pbrt::Normal3,_float>.x;
    local_228.intr.shading.n.super_Tuple3<pbrt::Normal3,_float>.y =
         local_128.shading.n.super_Tuple3<pbrt::Normal3,_float>.y;
    local_228.intr.shading.n.super_Tuple3<pbrt::Normal3,_float>.z =
         local_128.shading.n.super_Tuple3<pbrt::Normal3,_float>.z;
    local_228.intr.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.x =
         local_128.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.x;
    local_228.intr.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.y =
         local_128.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.y;
    local_228.intr.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.z =
         local_128.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.z;
    local_228.intr.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.x =
         local_128.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.x;
    local_228.intr.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.y =
         local_128.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.y;
    local_228.intr.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.z =
         local_128.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.z;
    local_228.intr.faceIndex = local_128.faceIndex;
    local_228.intr.material.
    super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
    .bits = local_128.material.
            super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
            .bits;
    local_228.intr.areaLight.
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    .bits = local_128.areaLight.
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            .bits;
    local_228.intr.dudy = local_128.dudy;
    local_228.intr.dvdy = local_128.dvdy;
    local_228.intr.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.dpdx.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.dpdy.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.dpdy.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.dudx = local_128.dudx;
    local_228.intr.dvdx = local_128.dvdx;
    pTVar10 = pstd::optional<pbrt::TriangleIntersection>::value(&local_23c);
    local_228.tHit = pTVar10->t;
    pstd::optional<pbrt::ShapeIntersection>::optional(__return_storage_ptr__,&local_228);
  }
  pstd::optional<pbrt::TriangleIntersection>::~optional(&local_23c);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> Triangle::Intersect(const Ray &ray, Float tMax) const {
#ifndef PBRT_IS_GPU_CODE
    ++nTriTests;
#endif
    // Get triangle vertices in _p0_, _p1_, and _p2_
    const TriangleMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[3 * triIndex];
    Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

    pstd::optional<TriangleIntersection> triIsect =
        IntersectTriangle(ray, tMax, p0, p1, p2);
    if (!triIsect)
        return {};
    SurfaceInteraction intr =
        InteractionFromIntersection(mesh, triIndex, *triIsect, ray.time, -ray.d);
#ifndef PBRT_IS_GPU_CODE
    ++nTriHits;
#endif
    return ShapeIntersection{intr, triIsect->t};
}